

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# foreign_interface.c
# Opt level: O2

double get_double(char *identifer,int line,Environment *env)

{
  Object o;
  Object local_50;
  
  env_get(&local_50,identifer,line,env);
  if ((local_50.type == OBJECT_LITERAL) && (local_50.field_1.literal.type < LIT_STRING)) {
    if (local_50.field_1.literal.type == LIT_INT) {
      local_50.field_1._8_8_ = (Instance *)(double)local_50.field_1._8_8_;
    }
    return (double)local_50.field_1.literal.field_2;
  }
  printf("\x1b[31m\n[Runtime Error] [Line:%d] Expected numeric value!\x1b[0m",line);
  stop();
}

Assistant:

double get_double(char *identifer, int line, Environment *env){
    Object o = env_get(identifer, line, env);
    if(o.type != OBJECT_LITERAL || !is_num(o)){
        printf(runtime_error("Expected numeric value!"), line);
        stop();
    }
    return get_val(o.literal);
}